

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O3

int Gia_ManVerifyCex(Gia_Man_t *pAig,Abc_Cex_t *p,int fDualOut)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  
  Gia_ManCleanMark0(pAig);
  iVar13 = pAig->nRegs;
  if (iVar13 < 1) {
    uVar7 = 0;
  }
  else {
    uVar14 = 0;
    do {
      iVar11 = pAig->vCis->nSize;
      uVar10 = (iVar11 - iVar13) + uVar14;
      if (((int)uVar10 < 0) || (iVar11 <= (int)uVar10)) goto LAB_007168b7;
      iVar11 = pAig->vCis->pArray[uVar10];
      lVar6 = (long)iVar11;
      if ((lVar6 < 0) || (pAig->nObjs <= iVar11)) goto LAB_00716898;
      pGVar3 = pAig->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        uVar7 = (ulong)uVar14;
        break;
      }
      uVar10 = uVar14 + 1;
      uVar7 = (ulong)uVar10;
      *(ulong *)(pGVar3 + lVar6) =
           *(ulong *)(pGVar3 + lVar6) & 0xffffffffbfffffff |
           (ulong)(((uint)(&p[1].iPo)[uVar14 >> 5] >> ((byte)uVar14 & 0x1f) & 1) << 0x1e);
      iVar13 = pAig->nRegs;
      uVar14 = uVar10;
    } while ((int)uVar10 < iVar13);
  }
  iVar11 = (int)uVar7;
  if (-1 < p->iFrame) {
    iVar12 = 0;
    do {
      pVVar9 = pAig->vCis;
      uVar15 = (ulong)(uint)pVVar9->nSize;
      if (iVar13 < pVVar9->nSize) {
        lVar6 = 0;
        do {
          if ((int)uVar15 <= lVar6) goto LAB_007168b7;
          lVar16 = (long)pVVar9->pArray[lVar6];
          if ((lVar16 < 0) || (iVar13 = pAig->nObjs, iVar13 <= pVVar9->pArray[lVar6]))
          goto LAB_00716898;
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) {
            uVar7 = (ulong)(uint)((int)uVar7 + (int)lVar6);
            goto LAB_0071659a;
          }
          *(ulong *)(pGVar3 + lVar16) =
               *(ulong *)(pGVar3 + lVar16) & 0xffffffffbfffffff |
               (ulong)(((uint)(&p[1].iPo)[(int)(uVar7 + lVar6) >> 5] >>
                        ((byte)(uVar7 + lVar6) & 0x1f) & 1) << 0x1e);
          lVar6 = lVar6 + 1;
          pVVar9 = pAig->vCis;
          uVar15 = (ulong)pVVar9->nSize;
        } while (lVar6 < (long)(uVar15 - (long)pAig->nRegs));
        uVar7 = (ulong)(uint)((int)uVar7 + (int)lVar6);
      }
      iVar13 = pAig->nObjs;
      if (0 < iVar13) {
LAB_0071659a:
        lVar6 = 0;
        lVar16 = 0;
        do {
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar15 = *(ulong *)(&pGVar3->field_0x0 + lVar6);
          if ((uVar15 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar15) {
            *(ulong *)(&pGVar3->field_0x0 + lVar6) =
                 uVar15 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar15 >> 0x3d) ^
                          *(uint *)((long)pGVar3 +
                                   (ulong)((uint)(uVar15 >> 0x1e) & 0x7ffffffc) * -3 + lVar6) >>
                          0x1e) & ((uint)(uVar15 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar3 +
                                           (ulong)(uint)((int)(uVar15 & 0x1fffffff) << 2) * -3 +
                                           lVar6) >> 0x1e) & 1) << 0x1e);
            iVar13 = pAig->nObjs;
          }
          lVar16 = lVar16 + 1;
          lVar6 = lVar6 + 0xc;
        } while (lVar16 < iVar13);
      }
      iVar11 = (int)uVar7;
      pVVar9 = pAig->vCos;
      if (0 < pVVar9->nSize) {
        lVar6 = 0;
        do {
          iVar13 = pVVar9->pArray[lVar6];
          if (((long)iVar13 < 0) || (pAig->nObjs <= iVar13)) goto LAB_00716898;
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = pAig->pObjs + iVar13;
          uVar14 = (uint)*(ulong *)pGVar3;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((uVar14 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar14 & 0x1fffffff))) & 0x40000000
                      );
          lVar6 = lVar6 + 1;
          pVVar9 = pAig->vCos;
        } while (lVar6 < pVVar9->nSize);
      }
      iVar8 = p->iFrame;
      if (iVar12 == iVar8) break;
      iVar13 = pAig->nRegs;
      if (0 < iVar13) {
        iVar8 = 0;
        do {
          iVar1 = pAig->vCos->nSize;
          uVar14 = (iVar1 - iVar13) + iVar8;
          if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) goto LAB_007168b7;
          iVar1 = pAig->vCos->pArray[uVar14];
          if (((long)iVar1 < 0) || (pAig->nObjs <= iVar1)) goto LAB_00716898;
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = pAig->vCis->nSize;
          uVar14 = (iVar2 - iVar13) + iVar8;
          if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_007168b7;
          uVar14 = pAig->vCis->pArray[uVar14];
          lVar6 = (long)(int)uVar14;
          if ((lVar6 < 0) || ((uint)pAig->nObjs <= uVar14)) goto LAB_00716898;
          *(ulong *)(pGVar3 + lVar6) =
               *(ulong *)(pGVar3 + lVar6) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar3 + iVar1) & 0x40000000);
          iVar8 = iVar8 + 1;
          iVar13 = pAig->nRegs;
        } while (iVar8 < iVar13);
        iVar8 = p->iFrame;
      }
      bVar5 = iVar12 < iVar8;
      iVar12 = iVar12 + 1;
    } while (bVar5);
  }
  if (iVar11 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCex.c"
                  ,0x47,"int Gia_ManVerifyCex(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  uVar14 = p->iPo;
  if (fDualOut == 0) {
    iVar13 = pAig->vCos->nSize;
    if (iVar13 - pAig->nRegs <= (int)uVar14) goto LAB_007168d6;
    if ((-1 < (int)uVar14) && ((int)uVar14 < iVar13)) {
      iVar13 = pAig->vCos->pArray[uVar14];
      if ((-1 < (long)iVar13) && (iVar13 < pAig->nObjs)) {
        uVar14 = (uint)*(undefined8 *)(pAig->pObjs + iVar13);
LAB_00716876:
        Gia_ManCleanMark0(pAig);
        return uVar14 >> 0x1e & 1;
      }
      goto LAB_00716898;
    }
  }
  else {
    uVar10 = uVar14 * 2;
    iVar13 = pAig->vCos->nSize;
    iVar11 = iVar13 - pAig->nRegs;
    if (iVar11 <= (int)uVar10) {
LAB_007168d6:
      __assert_fail("v < Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
    }
    if ((-1 < (int)uVar14) && ((int)uVar10 < iVar13)) {
      piVar4 = pAig->vCos->pArray;
      iVar12 = piVar4[uVar10];
      if ((-1 < (long)iVar12) && (iVar12 < pAig->nObjs)) {
        uVar10 = uVar10 | 1;
        if (iVar11 <= (int)uVar10) goto LAB_007168d6;
        if (iVar13 <= (int)uVar10) goto LAB_007168b7;
        uVar14 = piVar4[uVar10];
        if ((-1 < (long)(int)uVar14) && (uVar14 < (uint)pAig->nObjs)) {
          uVar14 = (uint)*(undefined8 *)(pAig->pObjs + iVar12) ^
                   (uint)*(undefined8 *)(pAig->pObjs + (int)uVar14);
          goto LAB_00716876;
        }
      }
LAB_00716898:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
  }
LAB_007168b7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Resimulates the counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManVerifyCex( Gia_Man_t * pAig, Abc_Cex_t * p, int fDualOut )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Gia_ManCleanMark0(pAig);
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
        }
    }
    assert( iBit == p->nBits );
    if ( fDualOut )
        RetValue = Gia_ManPo(pAig, 2*p->iPo)->fMark0 ^ Gia_ManPo(pAig, 2*p->iPo+1)->fMark0;
    else
        RetValue = Gia_ManPo(pAig, p->iPo)->fMark0;
    Gia_ManCleanMark0(pAig);
    return RetValue;
}